

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int termCanDriveIndex(WhereTerm *pTerm,SrcList_item *pSrc,Bitmask notReady)

{
  int iVar1;
  
  if ((((pTerm->leftCursor == pSrc->iCursor) && ((pTerm->eOperator & 0x82) != 0)) &&
      ((((pSrc->fg).jointype & 8) == 0 ||
       ((-1 < (char)pTerm->eOperator || ((pTerm->pExpr->flags & 1) != 0)))))) &&
     (((pTerm->prereqRight & notReady) == 0 && (-1 < (long)(pTerm->u).leftColumn)))) {
    iVar1 = sqlite3IndexAffinityOk(pTerm->pExpr,pSrc->pTab->aCol[(pTerm->u).leftColumn].affinity);
    return iVar1;
  }
  return 0;
}

Assistant:

static int termCanDriveIndex(
  WhereTerm *pTerm,              /* WHERE clause term to check */
  struct SrcList_item *pSrc,     /* Table we are trying to access */
  Bitmask notReady               /* Tables in outer loops of the join */
){
  char aff;
  if( pTerm->leftCursor!=pSrc->iCursor ) return 0;
  if( (pTerm->eOperator & (WO_EQ|WO_IS))==0 ) return 0;
  if( (pSrc->fg.jointype & JT_LEFT) 
   && !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
   && (pTerm->eOperator & WO_IS)
  ){
    /* Cannot use an IS term from the WHERE clause as an index driver for
    ** the RHS of a LEFT JOIN. Such a term can only be used if it is from
    ** the ON clause.  */
    return 0;
  }
  if( (pTerm->prereqRight & notReady)!=0 ) return 0;
  if( pTerm->u.leftColumn<0 ) return 0;
  aff = pSrc->pTab->aCol[pTerm->u.leftColumn].affinity;
  if( !sqlite3IndexAffinityOk(pTerm->pExpr, aff) ) return 0;
  testcase( pTerm->pExpr->op==TK_IS );
  return 1;
}